

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

BBox3fa * __thiscall
embree::SceneGraph::GroupNode::bounds(BBox3fa *__return_storage_ptr__,GroupNode *this)

{
  pointer pRVar1;
  pointer pRVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  aVar3 = _DAT_0024ec20;
  (__return_storage_ptr__->lower).field_0 = _DAT_0024ec20;
  aVar4 = _DAT_0024ec30;
  (__return_storage_ptr__->upper).field_0 = _DAT_0024ec30;
  pRVar2 = (this->children).
           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->children).
           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar2 != pRVar1) {
    aVar4 = _DAT_0024ec30;
    do {
      (*(pRVar2->ptr->super_RefCount)._vptr_RefCount[10])(local_48);
      aVar3.m128 = (__m128)minps(aVar3.m128,local_48);
      aVar4.m128 = (__m128)maxps(aVar4.m128,local_38);
      pRVar2 = pRVar2 + 1;
    } while (pRVar2 != pRVar1);
  }
  (__return_storage_ptr__->lower).field_0 = aVar3;
  (__return_storage_ptr__->upper).field_0 = aVar4;
  return __return_storage_ptr__;
}

Assistant:

virtual BBox3fa bounds() const
      {
        BBox3fa b = empty;
        for (auto& c : children) b.extend(c->bounds());
        return b;
      }